

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

bool __thiscall
llvm::
DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::allocateBuckets(DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                  *this,uint Num)

{
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *pDVar1;
  
  this->NumBuckets = Num;
  if (Num == 0) {
    pDVar1 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0;
  }
  else {
    pDVar1 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)operator_new((ulong)Num << 4);
  }
  this->Buckets = pDVar1;
  return Num != 0;
}

Assistant:

bool allocateBuckets(unsigned Num) {
    NumBuckets = Num;
    if (NumBuckets == 0) {
      Buckets = nullptr;
      return false;
    }

    Buckets = static_cast<BucketT*>(operator new(sizeof(BucketT) * NumBuckets));
    return true;
  }